

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_io.c
# Opt level: O2

ssize_t kvtree_read_attempt(char *file,int fd,void *buf,size_t size)

{
  uint uVar1;
  ssize_t sVar2;
  uint *puVar3;
  char *pcVar4;
  ulong uVar5;
  int local_44;
  
  local_44 = 10;
  uVar5 = 0;
  do {
    while( true ) {
      if (size <= uVar5) {
        return uVar5;
      }
      sVar2 = read(fd,(void *)((long)buf + uVar5),size - uVar5);
      uVar1 = (uint)sVar2;
      if (0 < (int)uVar1) break;
      if (uVar1 == 0) {
        return uVar5;
      }
      puVar3 = (uint *)__errno_location();
      uVar1 = *puVar3;
      if ((uVar1 != 4) && (uVar1 != 0xb)) {
        pcVar4 = strerror(uVar1);
        local_44 = local_44 + -1;
        if (local_44 == 0) {
          kvtree_err("Giving up read on file %s errno=%d %s @ %s:%d",file,(ulong)uVar1,pcVar4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_io.c"
                     ,0x11f);
          return -1;
        }
        kvtree_err("Error reading file %s errno=%d %s @ %s:%d",file,(ulong)uVar1,pcVar4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_io.c"
                   ,0x11a);
      }
    }
    uVar5 = uVar5 + (uVar1 & 0x7fffffff);
  } while( true );
}

Assistant:

ssize_t kvtree_read_attempt(const char* file, int fd, void* buf, size_t size)
{
  ssize_t n = 0;
  int retries = 10;
  while (n < size)
  {
    int rc = read(fd, (char*) buf + n, size - n);
    if (rc  > 0) {
      n += rc;
    } else if (rc == 0) {
      /* EOF */
      return n;
    } else { /* (rc < 0) */
      /* got an error, check whether it was serious */
      if (errno == EINTR || errno == EAGAIN) {
        continue;
      }

      /* something worth printing an error about */
      retries--;
      if (retries) {
        /* print an error and try again */
        kvtree_err("Error reading file %s errno=%d %s @ %s:%d",
          file, errno, strerror(errno), __FILE__, __LINE__
        );
      } else {
        /* too many failed retries, give up */
        kvtree_err("Giving up read on file %s errno=%d %s @ %s:%d",
	  file, errno, strerror(errno), __FILE__, __LINE__
        );
        return -1;
      }
    }
  }
  return n;
}